

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O3

void linux_libkqueue_fork(void)

{
  kqueue *pkVar1;
  kqueue_head kVar2;
  
  monitoring_tid = 0;
  kVar2.lh_first = kq_list.lh_first;
  if (kq_list.lh_first != (kqueue *)0x0) {
    do {
      pkVar1 = ((kVar2.lh_first)->kq_entry).le_next;
      close((kVar2.lh_first)->epollfd);
      (kVar2.lh_first)->epollfd = -1;
      if (0 < (kVar2.lh_first)->pipefd[0]) {
        close((kVar2.lh_first)->pipefd[0]);
      }
      (kVar2.lh_first)->pipefd[0] = -1;
      if (0 < (kVar2.lh_first)->pipefd[1]) {
        close((kVar2.lh_first)->pipefd[1]);
      }
      (kVar2.lh_first)->pipefd[1] = -1;
      kVar2.lh_first = pkVar1;
    } while (pkVar1 != (kqueue *)0x0);
  }
  return;
}

Assistant:

static void
linux_libkqueue_fork(void)
{
    struct kqueue *kq, *kq_tmp;

    /*
     * We don't have to cancel the monitor thread here
     * as fork() typically only duplicates the thread
     * which called it.
     *
     * Ensure we don't try and cancel it on exit by
     * clearing the thread id.
     *
     * We don't need to lock the kq_mtx here as we're in
     * the child, and none of our threads will have been
     * duplicated.
     */
    monitoring_tid = 0;

    /*
     * If the process has been forked, then we need
     * to destroy all of the kqueue instances in
     * the fork.
     *
     * This replicates the behaviour of real kqueues
     * on FreeBSD, and also prevents spurious leak
     * reports being raised by LSAN.
     */
    LIST_FOREACH_SAFE(kq, &kq_list, kq_entry, kq_tmp) {
        dbg_printf("kq=%p - cleaning up on fork", kq);

        /*
         * There's very limited cleanups we can do
         * here, as we're only allowed to call
         * async-signal-safe functions in this
         * handler.
         *
         * This means any functions which alloc or
         * free memory are ruled out, meaning we
         * can't release any of the memory allocated
         * to the kqueues or filters.
         *
         * Fortunately close() is async-signal-safe.
         */
        close(kq->epollfd);
        kq->epollfd = -1;

        if ((kq->pipefd[0] > 0) && (close(kq->pipefd[0]) < 0))
            dbg_perror("close(2)");
        kq->pipefd[0] = -1;

        if ((kq->pipefd[1] > 0) && (close(kq->pipefd[1]) < 0))
            dbg_perror("close(2)");
        kq->pipefd[1] = -1;
    }
}